

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::clean
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this)

{
  resizable_tensor *in_RDI;
  con_<64L,_7L,_7L,_2,_2,_0,_0> *unaff_retaddr;
  
  resizable_tensor::clear(in_RDI);
  resizable_tensor::clear(in_RDI);
  resizable_tensor::clear(in_RDI);
  resizable_tensor::clear(in_RDI);
  resizable_tensor::clear(in_RDI);
  *(undefined1 *)
   ((long)&in_RDI[2].data_instance.cuda_stream.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 1) = 1;
  call_clean_method_if_exists<dlib::con_<64l,7l,7l,2,2,0,0>>(unaff_retaddr);
  return;
}

Assistant:

void clean()
        {
            x_grad.clear();
            grad_final.clear();
            cached_output.clear();
            params_grad.clear();
            temp_tensor.clear();
            gradient_input_is_stale = true;
            call_clean_method_if_exists(details);
        }